

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O3

void __thiscall CP::list<int>::print(list<int> *this)

{
  ostream *poVar1;
  int iVar2;
  node *pnVar3;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," Size = ",8);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout," Header address = ",0x12);
  poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," (prev = ",9);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," next = ",8);
  poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  pnVar3 = this->mHeader->next;
  if (this->mHeader != pnVar3) {
    iVar2 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Node ",5);
      poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,": ",2);
      std::ostream::operator<<((ostream *)poVar1,pnVar3->data);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," (prev = ",9);
      poVar1 = std::ostream::_M_insert<void_const*>(&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", I\'m at ",9);
      poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,", next = ",9);
      poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      iVar2 = iVar2 + 1;
      pnVar3 = pnVar3->next;
    } while (this->mHeader != pnVar3);
  }
  return;
}

Assistant:

void print() {
      std::cout << " Size = " << mSize << std::endl;
      std::cout << " Header address = " << (mHeader) << " (prev = " << mHeader->prev << " next = " << mHeader->next << ")" << std::endl;
      int i = 0;
      iterator before;
      for (iterator it = begin();it!=end();before = it, it++,i++) {
        std::cout << "Node " << i << ": " << *it;
        std::cout << " (prev = " << it.ptr->prev << ", I'm at " << it.ptr << ", next = " << it.ptr->next << ")" <<  std:: endl;
      }
    }